

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QList<bool_(*)(void_**)>_>::reallocate
          (QMovableArrayOps<QList<bool_(*)(void_**)>_> *this,qsizetype alloc,AllocationOption option
          )

{
  pair<QTypedArrayData<QList<bool_(*)(void_**)>_>_*,_QList<bool_(*)(void_**)>_*> pVar1;
  
  pVar1 = QTypedArrayData<QList<bool_(*)(void_**)>_>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<QList<bool_(*)(void_**)>_>).
                     super_QArrayDataPointer<QList<bool_(*)(void_**)>_>.d,
                     (this->super_QGenericArrayOps<QList<bool_(*)(void_**)>_>).
                     super_QArrayDataPointer<QList<bool_(*)(void_**)>_>.ptr,alloc,option);
  if (pVar1.second != (QList<bool_(*)(void_**)> *)0x0) {
    (this->super_QGenericArrayOps<QList<bool_(*)(void_**)>_>).
    super_QArrayDataPointer<QList<bool_(*)(void_**)>_>.d = pVar1.first;
    (this->super_QGenericArrayOps<QList<bool_(*)(void_**)>_>).
    super_QArrayDataPointer<QList<bool_(*)(void_**)>_>.ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }